

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPlaceholderExpander.cxx
# Opt level: O1

string * __thiscall cmPlaceholderExpander::ExpandVariables(cmPlaceholderExpander *this,string *s)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  string var;
  string expandedInput;
  string replace;
  long *local_b8 [2];
  long local_a8 [2];
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long *local_78;
  long local_70;
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  cmPlaceholderExpander *local_38;
  
  cVar5 = (char)s;
  local_38 = this;
  uVar3 = std::__cxx11::string::find(cVar5,0x3c);
  if (uVar3 != 0xffffffffffffffff) {
    local_98 = &local_88;
    local_90 = 0;
    local_88 = 0;
    do {
      if ((uVar3 == 0xffffffffffffffff) || (s->_M_string_length - 2 <= uVar3)) {
        std::__cxx11::string::substr((ulong)local_b8,(ulong)s);
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8[0]);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        std::__cxx11::string::_M_assign((string *)s);
        break;
      }
      lVar4 = std::__cxx11::string::find(cVar5,0x3e);
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)s);
      }
      else {
        iVar2 = isalpha((int)(s->_M_dataplus)._M_p[uVar3 + 1]);
        if (iVar2 == 0) {
          uVar3 = std::__cxx11::string::find(cVar5,0x3c);
        }
        else {
          std::__cxx11::string::substr((ulong)local_b8,(ulong)s);
          (*local_38->_vptr_cmPlaceholderExpander[2])(&local_78,local_38,local_b8);
          std::__cxx11::string::substr((ulong)local_58,(ulong)s);
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_58[0]);
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
          if ((((uVar3 != 0) && (local_70 == 0)) &&
              (pcVar1 = (s->_M_dataplus)._M_p, pcVar1[uVar3 - 1] == ' ')) &&
             ((lVar4 + 1U < s->_M_string_length && (pcVar1[lVar4 + 1U] == ' ')))) {
            std::__cxx11::string::pop_back();
          }
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78);
          uVar3 = std::__cxx11::string::find(cVar5,0x3c);
          if (local_78 != local_68) {
            operator_delete(local_78,local_68[0] + 1);
          }
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0],local_a8[0] + 1);
          }
        }
      }
    } while (lVar4 != -1);
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
  }
  return s;
}

Assistant:

std::string& cmPlaceholderExpander::ExpandVariables(std::string& s)
{
  std::string::size_type start = s.find('<');
  // no variables to expand
  if (start == std::string::npos) {
    return s;
  }
  std::string::size_type pos = 0;
  std::string expandedInput;
  while (start != std::string::npos && start < s.size() - 2) {
    std::string::size_type end = s.find('>', start);
    // if we find a < with no > we are done
    if (end == std::string::npos) {
      s = expandedInput;
      return s;
    }
    char c = s[start + 1];
    // if the next char after the < is not A-Za-z then
    // skip it and try to find the next < in the string
    if (!isalpha(c)) {
      start = s.find('<', start + 1);
    } else {
      // extract the var
      std::string var = s.substr(start + 1, end - start - 1);
      std::string replace = this->ExpandVariable(var);
      expandedInput += s.substr(pos, start - pos);

      // Prevent consecutive whitespace in the output if the rule variable
      // expands to an empty string.
      bool consecutive = replace.empty() && start > 0 && s[start - 1] == ' ' &&
        end + 1 < s.size() && s[end + 1] == ' ';
      if (consecutive) {
        expandedInput.pop_back();
      }

      expandedInput += replace;

      // move to next one
      start = s.find('<', start + var.size() + 2);
      pos = end + 1;
    }
  }
  // add the rest of the input
  expandedInput += s.substr(pos, s.size() - pos);
  s = expandedInput;

  return s;
}